

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::cpp::CppGenerator::GenUnpackFieldStatement_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,FieldDef *field,FieldDef *union_field)

{
  EnumDef *def;
  bool bVar1;
  Value *pVVar2;
  string *psVar3;
  Value *local_968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_928;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_908;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c8;
  allocator<char> local_8a1;
  string local_8a0;
  string local_880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_840;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_800;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c0;
  string local_7a0;
  undefined1 local_780 [8];
  string out_field;
  undefined1 local_758 [7];
  bool is_pointer_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  string local_6f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_678;
  allocator<char> local_651;
  string local_650;
  Value *local_630;
  Value *cpp_type_1;
  string local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  Type local_528;
  string local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  byte local_3a1;
  undefined1 local_3a0 [7];
  bool is_pointer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  allocator<char> local_219;
  string local_218;
  Value *local_1f8;
  Value *cpp_type;
  char *access;
  string local_1e0;
  string local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  undefined1 local_160 [8];
  string indexing;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_c0 [8];
  string vector_field;
  string local_80;
  undefined1 local_50 [8];
  string name;
  FieldDef *union_field_local;
  FieldDef *field_local;
  CppGenerator *this_local;
  string *code;
  
  name.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  switch((field->value).type.base_type) {
  case BASE_TYPE_UTYPE:
    if ((union_field->value).type.base_type != BASE_TYPE_UNION) {
      __assert_fail("union_field->value.type.base_type == BASE_TYPE_UNION",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_cpp.cpp"
                    ,0xd0a,
                    "std::string flatbuffers::cpp::CppGenerator::GenUnpackFieldStatement(const FieldDef &, const FieldDef *)"
                   );
    }
    std::operator+(&local_5a8,"_o->",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)union_field)
    ;
    std::operator+(&local_588,&local_5a8,".type = _e;");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_588);
    std::__cxx11::string::~string((string *)&local_588);
    std::__cxx11::string::~string((string *)&local_5a8);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_650,"cpp_type",&local_651);
    pVVar2 = SymbolTable<flatbuffers::Value>::Lookup
                       (&(field->super_Definition).attributes,&local_650);
    std::__cxx11::string::~string((string *)&local_650);
    std::allocator<char>::~allocator(&local_651);
    local_630 = pVVar2;
    if (pVVar2 == (Value *)0x0) {
      out_field.field_2._M_local_buf[0xf] = IsPointer(field);
      Name_abi_cxx11_(&local_7a0,this,field);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_780,
                     "_o->",&local_7a0);
      std::__cxx11::string::~string((string *)&local_7a0);
      if ((out_field.field_2._M_local_buf[0xf] & 1U) != 0) {
        std::operator+(&local_7e0,"{ if(",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_780);
        std::operator+(&local_7c0,&local_7e0,") { ");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_7c0);
        std::__cxx11::string::~string((string *)&local_7c0);
        std::__cxx11::string::~string((string *)&local_7e0);
        std::operator+(&local_820,"_e->UnPackTo(",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_780);
        std::operator+(&local_800,&local_820,".get(), _resolver);");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_800);
        std::__cxx11::string::~string((string *)&local_800);
        std::__cxx11::string::~string((string *)&local_820);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__," } else { ");
      }
      std::operator+(&local_840,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_780,
                     " = ");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_840);
      std::__cxx11::string::~string((string *)&local_840);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_8a0,"_e",&local_8a1);
      GenUnpackVal(&local_880,this,&(field->value).type,&local_8a0,false,field);
      std::operator+(&local_860,&local_880,";");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_860);
      std::__cxx11::string::~string((string *)&local_860);
      std::__cxx11::string::~string((string *)&local_880);
      std::__cxx11::string::~string((string *)&local_8a0);
      std::allocator<char>::~allocator(&local_8a1);
      if ((out_field.field_2._M_local_buf[0xf] & 1U) != 0) {
        std::operator+(&local_928," } } else if (",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_780);
        std::operator+(&local_908,&local_928,") { ");
        std::operator+(&local_8e8,&local_908,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_780);
        std::operator+(&local_8c8,&local_8e8,".reset(); }");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_8c8);
        std::__cxx11::string::~string((string *)&local_8c8);
        std::__cxx11::string::~string((string *)&local_8e8);
        std::__cxx11::string::~string((string *)&local_908);
        std::__cxx11::string::~string((string *)&local_928);
      }
      std::__cxx11::string::~string((string *)local_780);
    }
    else {
      psVar3 = PtrType_abi_cxx11_(this,field);
      std::operator+(&local_698,"/*scalar resolver, ",psVar3);
      std::operator+(&local_678,&local_698,"*/ ");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_678);
      std::__cxx11::string::~string((string *)&local_678);
      std::__cxx11::string::~string((string *)&local_698);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"if (_resolver) ");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"(*_resolver)");
      Name_abi_cxx11_(&local_6f8,this,field);
      std::operator+(&local_6d8,"(reinterpret_cast<void **>(&_o->",&local_6f8);
      std::operator+(&local_6b8,&local_6d8,"), ");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_6b8);
      std::__cxx11::string::~string((string *)&local_6b8);
      std::__cxx11::string::~string((string *)&local_6d8);
      std::__cxx11::string::~string((string *)&local_6f8);
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,"static_cast<::flatbuffers::hash_value_t>(_e));");
      psVar3 = PtrType_abi_cxx11_(this,field);
      bVar1 = std::operator==(psVar3,"naked");
      if (bVar1) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__," else ");
        Name_abi_cxx11_((string *)local_758,this,field);
        std::operator+(&local_738,"_o->",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_758);
        std::operator+(&local_718,&local_738," = nullptr;");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_718);
        std::__cxx11::string::~string((string *)&local_718);
        std::__cxx11::string::~string((string *)&local_738);
        std::__cxx11::string::~string((string *)local_758);
      }
      else {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/* else do nothing */;");
      }
    }
    break;
  case BASE_TYPE_VECTOR:
  case BASE_TYPE_VECTOR64:
    Name_abi_cxx11_((string *)local_50,this,field);
    if ((field->value).type.element == BASE_TYPE_UTYPE) {
      Name_abi_cxx11_((string *)((long)&vector_field.field_2 + 8),this,field);
      StripUnionType(&local_80,this,(string *)((long)&vector_field.field_2 + 8));
      std::__cxx11::string::operator=((string *)local_50,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)(vector_field.field_2._M_local_buf + 8));
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                   "_o->",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_50);
    std::operator+(&local_100,"{ ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
    std::operator+(&local_e0,&local_100,".resize(_e->size()); ");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    if ((((field->value).type.enum_def != (EnumDef *)0x0) ||
        (bVar1 = IsBool((field->value).type.element), bVar1)) ||
       (bVar1 = IsOneByte((field->value).type.element), !bVar1)) {
      std::__cxx11::string::string((string *)local_160);
      if ((field->value).type.enum_def != (EnumDef *)0x0) {
        def = (field->value).type.enum_def;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1e0,"",(allocator<char> *)((long)&access + 7));
        BaseGenerator::WrapInNameSpace
                  (&local_1c0,&this->super_BaseGenerator,&def->super_Definition,&local_1e0);
        std::operator+(&local_1a0,"static_cast<",&local_1c0);
        std::operator+(&local_180,&local_1a0,">(");
        std::__cxx11::string::operator+=((string *)local_160,(string *)&local_180);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&access + 7));
      }
      std::__cxx11::string::operator+=((string *)local_160,"_e->Get(_i)");
      if ((field->value).type.enum_def != (EnumDef *)0x0) {
        std::__cxx11::string::operator+=((string *)local_160,")");
      }
      if ((field->value).type.element == BASE_TYPE_BOOL) {
        std::__cxx11::string::operator+=((string *)local_160," != 0");
      }
      if ((field->value).type.element == BASE_TYPE_UTYPE) {
        local_968 = (Value *)0x413688;
      }
      else {
        local_968 = (Value *)0x41cc34;
        if ((field->value).type.element == BASE_TYPE_UNION) {
          local_968 = (Value *)0x4179b9;
        }
      }
      cpp_type = local_968;
      if ((field->value).type.base_type == BASE_TYPE_VECTOR64) {
        std::__cxx11::string::operator+=
                  ((string *)__return_storage_ptr__,"for (::flatbuffers::uoffset64_t _i = 0;");
      }
      else {
        std::__cxx11::string::operator+=
                  ((string *)__return_storage_ptr__,"for (::flatbuffers::uoffset_t _i = 0;");
      }
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__," _i < _e->size(); _i++) { ");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"cpp_type",&local_219)
      ;
      pVVar2 = SymbolTable<flatbuffers::Value>::Lookup
                         (&(field->super_Definition).attributes,&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::allocator<char>::~allocator(&local_219);
      local_1f8 = pVVar2;
      if (pVVar2 == (Value *)0x0) {
        local_3a1 = IsVectorOfPointers(field);
        if ((bool)local_3a1) {
          std::operator+(&local_408,"if(_o->",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_50);
          std::operator+(&local_3e8,&local_408,"[_i]");
          std::operator+(&local_3c8,&local_3e8,") { ");
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_3c8);
          std::__cxx11::string::~string((string *)&local_3c8);
          std::__cxx11::string::~string((string *)&local_3e8);
          std::__cxx11::string::~string((string *)&local_408);
          std::operator+(&local_468,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_160,"->UnPackTo(_o->");
          std::operator+(&local_448,&local_468,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_50);
          std::operator+(&local_428,&local_448,"[_i].get(), _resolver);");
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_428);
          std::__cxx11::string::~string((string *)&local_428);
          std::__cxx11::string::~string((string *)&local_448);
          std::__cxx11::string::~string((string *)&local_468);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__," } else { ");
        }
        std::operator+(&local_4e8,"_o->",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                      );
        std::operator+(&local_4c8,&local_4e8,"[_i]");
        std::operator+(&local_4a8,&local_4c8,(char *)cpp_type);
        std::operator+(&local_488,&local_4a8," = ");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_488);
        std::__cxx11::string::~string((string *)&local_488);
        std::__cxx11::string::~string((string *)&local_4a8);
        std::__cxx11::string::~string((string *)&local_4c8);
        std::__cxx11::string::~string((string *)&local_4e8);
        Type::VectorType(&local_528,&(field->value).type);
        GenUnpackVal(&local_508,this,&local_528,(string *)local_160,true,field);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_508);
        std::__cxx11::string::~string((string *)&local_508);
        if ((local_3a1 & 1) != 0) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"; }");
        }
      }
      else {
        psVar3 = PtrType_abi_cxx11_(this,field);
        std::operator+(&local_260,"/*vector resolver, ",psVar3);
        std::operator+(&local_240,&local_260,"*/ ");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_240);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::string::~string((string *)&local_260);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"if (_resolver) ");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"(*_resolver)");
        std::operator+(&local_2e0,"(reinterpret_cast<void **>(&_o->",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                      );
        std::operator+(&local_2c0,&local_2e0,"[_i]");
        std::operator+(&local_2a0,&local_2c0,(char *)cpp_type);
        std::operator+(&local_280,&local_2a0,"), ");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_280);
        std::__cxx11::string::~string((string *)&local_280);
        std::__cxx11::string::~string((string *)&local_2a0);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__cxx11::string::~string((string *)&local_2e0);
        std::operator+(&local_320,"static_cast<::flatbuffers::hash_value_t>(",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_160);
        std::operator+(&local_300,&local_320,"));");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_300);
        std::__cxx11::string::~string((string *)&local_300);
        std::__cxx11::string::~string((string *)&local_320);
        psVar3 = PtrType_abi_cxx11_(this,field);
        bVar1 = std::operator==(psVar3,"naked");
        if (bVar1) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__," else ");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_3a0,"_o->",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_50);
          std::operator+(&local_380,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_3a0,"[_i]");
          std::operator+(&local_360,&local_380,(char *)cpp_type);
          std::operator+(&local_340,&local_360," = nullptr");
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_340);
          std::__cxx11::string::~string((string *)&local_340);
          std::__cxx11::string::~string((string *)&local_360);
          std::__cxx11::string::~string((string *)&local_380);
          std::__cxx11::string::~string((string *)local_3a0);
        }
        else {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/* else do nothing */")
          ;
        }
      }
      std::operator+(&local_568,"; } } else { ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
      std::operator+(&local_548,&local_568,".resize(0); }");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_548);
      std::__cxx11::string::~string((string *)&local_548);
      std::__cxx11::string::~string((string *)&local_568);
      std::__cxx11::string::~string((string *)local_160);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&indexing.field_2 + 8),"std::copy(_e->begin(), _e->end(), _o->",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
      std::operator+(&local_120,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&indexing.field_2 + 8),".begin()); }");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_120);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)(indexing.field_2._M_local_buf + 8));
    }
    std::__cxx11::string::~string((string *)local_c0);
    std::__cxx11::string::~string((string *)local_50);
    break;
  case BASE_TYPE_UNION:
    Name_abi_cxx11_(&local_608,this,field);
    std::operator+(&local_5e8,"_o->",&local_608);
    std::operator+(&local_5c8,&local_5e8,".value = ");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_5c8);
    std::__cxx11::string::~string((string *)&local_5c8);
    std::__cxx11::string::~string((string *)&local_5e8);
    std::__cxx11::string::~string((string *)&local_608);
    GenUnionUnpackVal_abi_cxx11_((string *)&cpp_type_1,this,field,"","");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&cpp_type_1);
    std::__cxx11::string::~string((string *)&cpp_type_1);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,";");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenUnpackFieldStatement(const FieldDef &field,
                                      const FieldDef *union_field) {
    std::string code;
    switch (field.value.type.base_type) {
      case BASE_TYPE_VECTOR64:
      case BASE_TYPE_VECTOR: {
        auto name = Name(field);
        if (field.value.type.element == BASE_TYPE_UTYPE) {
          name = StripUnionType(Name(field));
        }
        const std::string vector_field = "_o->" + name;
        code += "{ " + vector_field + ".resize(_e->size()); ";
        if (!field.value.type.enum_def && !IsBool(field.value.type.element) &&
            IsOneByte(field.value.type.element)) {
          // For vectors of bytes, std::copy is used to improve performance.
          // This doesn't work for:
          //  - enum types because they have to be explicitly static_cast.
          //  - vectors of bool, since they are a template specialization.
          //  - multiple-byte types due to endianness.
          code +=
              "std::copy(_e->begin(), _e->end(), _o->" + name + ".begin()); }";
        } else {
          std::string indexing;
          if (field.value.type.enum_def) {
            indexing += "static_cast<" +
                        WrapInNameSpace(*field.value.type.enum_def) + ">(";
          }
          indexing += "_e->Get(_i)";
          if (field.value.type.enum_def) { indexing += ")"; }
          if (field.value.type.element == BASE_TYPE_BOOL) {
            indexing += " != 0";
          }
          // Generate code that pushes data from _e to _o in the form:
          //   for (uoffset_t i = 0; i < _e->size(); ++i) {
          //     _o->field.push_back(_e->Get(_i));
          //   }
          auto access =
              field.value.type.element == BASE_TYPE_UTYPE
                  ? ".type"
                  : (field.value.type.element == BASE_TYPE_UNION ? ".value"
                                                                 : "");
          if (field.value.type.base_type == BASE_TYPE_VECTOR64) {
            code += "for (::flatbuffers::uoffset64_t _i = 0;";
          } else {
            code += "for (::flatbuffers::uoffset_t _i = 0;";
          }
          code += " _i < _e->size(); _i++) { ";
          auto cpp_type = field.attributes.Lookup("cpp_type");
          if (cpp_type) {
            // Generate code that resolves the cpp pointer type, of the form:
            //  if (resolver)
            //    (*resolver)(&_o->field, (hash_value_t)(_e));
            //  else
            //    _o->field = nullptr;
            code += "/*vector resolver, " + PtrType(&field) + "*/ ";
            code += "if (_resolver) ";
            code += "(*_resolver)";
            code += "(reinterpret_cast<void **>(&_o->" + name + "[_i]" +
                    access + "), ";
            code +=
                "static_cast<::flatbuffers::hash_value_t>(" + indexing + "));";
            if (PtrType(&field) == "naked") {
              code += " else ";
              code += "_o->" + name + "[_i]" + access + " = nullptr";
            } else {
              // code += " else ";
              // code += "_o->" + name + "[_i]" + access + " = " +
              // GenTypeNativePtr(cpp_type->constant, &field, true) + "();";
              code += "/* else do nothing */";
            }
          } else {
            const bool is_pointer = IsVectorOfPointers(field);
            if (is_pointer) {
              code += "if(_o->" + name + "[_i]" + ") { ";
              code += indexing + "->UnPackTo(_o->" + name +
                      "[_i].get(), _resolver);";
              code += " } else { ";
            }
            code += "_o->" + name + "[_i]" + access + " = ";
            code += GenUnpackVal(field.value.type.VectorType(), indexing, true,
                                 field);
            if (is_pointer) { code += "; }"; }
          }
          code += "; } } else { " + vector_field + ".resize(0); }";
        }
        break;
      }
      case BASE_TYPE_UTYPE: {
        FLATBUFFERS_ASSERT(union_field->value.type.base_type ==
                           BASE_TYPE_UNION);
        // Generate code that sets the union type, of the form:
        //   _o->field.type = _e;
        code += "_o->" + union_field->name + ".type = _e;";
        break;
      }
      case BASE_TYPE_UNION: {
        // Generate code that sets the union value, of the form:
        //   _o->field.value = Union::Unpack(_e, field_type(), resolver);
        code += "_o->" + Name(field) + ".value = ";
        code += GenUnionUnpackVal(field, "", "");
        code += ";";
        break;
      }
      default: {
        auto cpp_type = field.attributes.Lookup("cpp_type");
        if (cpp_type) {
          // Generate code that resolves the cpp pointer type, of the form:
          //  if (resolver)
          //    (*resolver)(&_o->field, (hash_value_t)(_e));
          //  else
          //    _o->field = nullptr;
          code += "/*scalar resolver, " + PtrType(&field) + "*/ ";
          code += "if (_resolver) ";
          code += "(*_resolver)";
          code += "(reinterpret_cast<void **>(&_o->" + Name(field) + "), ";
          code += "static_cast<::flatbuffers::hash_value_t>(_e));";
          if (PtrType(&field) == "naked") {
            code += " else ";
            code += "_o->" + Name(field) + " = nullptr;";
          } else {
            // code += " else ";
            // code += "_o->" + Name(field) + " = " +
            // GenTypeNativePtr(cpp_type->constant, &field, true) + "();";
            code += "/* else do nothing */;";
          }
        } else {
          // Generate code for assigning the value, of the form:
          //  _o->field = value;
          const bool is_pointer = IsPointer(field);

          const std::string out_field = "_o->" + Name(field);

          if (is_pointer) {
            code += "{ if(" + out_field + ") { ";
            code += "_e->UnPackTo(" + out_field + ".get(), _resolver);";
            code += " } else { ";
          }
          code += out_field + " = ";
          code += GenUnpackVal(field.value.type, "_e", false, field) + ";";
          if (is_pointer) {
            code += " } } else if (" + out_field + ") { " + out_field +
                    ".reset(); }";
          }
        }
        break;
      }
    }
    return code;
  }